

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O3

void prng_free(prng *pr)

{
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var1;
  long lVar2;
  
  smemclr(&pr[1].binarysink_[0].writefmtv,0x10);
  lVar2 = 0x12;
  do {
    (**(code **)(**(long **)((long)pr->binarysink_ + lVar2 * 8 + -8) + 0x20))();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x32);
  p_Var1 = pr[1].binarysink_[0].write;
  if (p_Var1 != (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
    (**(code **)(*(long *)p_Var1 + 0x20))();
  }
  if ((long *)pr[2].savesize != (long *)0x0) {
    (**(code **)(*(long *)pr[2].savesize + 0x20))();
  }
  smemclr(pr,0x1a8);
  safefree(pr);
  return;
}

Assistant:

void prng_free(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    smemclr(pi->counter, sizeof(pi->counter));
    for (size_t i = 0; i < NCOLLECTORS; i++)
        ssh_hash_free(pi->collectors[i]);
    if (pi->generator)
        ssh_hash_free(pi->generator);
    if (pi->keymaker)
        ssh_hash_free(pi->keymaker);
    smemclr(pi, sizeof(*pi));
    sfree(pi);
}